

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *param_2,
          ServiceDescriptor *result,FlatAllocator *alloc)

{
  int iVar1;
  string *psVar2;
  PointerT<char> pcVar3;
  ushort *puVar4;
  int iVar5;
  int extraout_EAX;
  undefined8 *puVar6;
  DescriptorNames DVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *proto_00;
  Nonnull<const_char_*> pcVar8;
  long lVar9;
  long unaff_RBP;
  long lVar10;
  size_t v2;
  string_view option_name;
  string_view name;
  string_view proto_name;
  string_view full_name;
  string_view scope;
  string_view name_00;
  string_view full_name_00;
  
  psVar2 = this->file_->package_;
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  proto_name._M_str = (char *)*puVar6;
  proto_name._M_len = puVar6[1];
  scope._M_str = (psVar2->_M_dataplus)._M_p;
  scope._M_len = psVar2->_M_string_length;
  DVar7 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar7.payload_;
  result->file_ = this->file_;
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  v2 = puVar6[1];
  full_name._M_len = (Proto *)(ulong)*(ushort *)(DVar7.payload_ + 2);
  full_name._M_str = DVar7.payload_ + ~(ulong)full_name._M_len;
  name_00._M_str = (char *)*puVar6;
  name_00._M_len = v2;
  ValidateSymbolName(this,name_00,full_name,&proto->super_Message);
  iVar1 = *(int *)((long)&proto->field_0 + 0x10);
  result->method_count_ = iVar1;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildService((DescriptorBuilder *)&stack0xffffffffffffffc0);
    proto = full_name._M_len;
    iVar5 = extraout_EAX;
  }
  else {
    iVar5 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<char>.value;
    unaff_RBP = (long)iVar5;
    iVar5 = iVar1 * 0x50 + iVar5;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar5;
    iVar1 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_.payload_.super_Base<char>.value;
    v2 = (size_t)iVar1;
    if (iVar5 <= iVar1) {
      pcVar8 = (Nonnull<const_char_*>)0x0;
      goto LAB_0021c790;
    }
  }
  pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((long)iVar5,v2,"used <= total_.template Get<TypeToUse>()");
LAB_0021c790:
  if (pcVar8 == (Nonnull<const_char_*>)0x0) {
    result->methods_ = (MethodDescriptor *)(pcVar3 + unaff_RBP);
    if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
      lVar9 = 0;
      lVar10 = 0;
      do {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                             (&(proto->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                              (int)lVar10);
        BuildMethod(this,proto_00,result,
                    (MethodDescriptor *)(&result->methods_->super_SymbolBase + lVar9),alloc);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x50;
      } while (lVar10 < *(int *)((long)&proto->field_0 + 0x10));
    }
    option_name._M_str = "google.protobuf.ServiceOptions";
    option_name._M_len = 0x1e;
    AllocateOptions<google::protobuf::ServiceDescriptor>(this,proto,result,3,option_name,alloc);
    puVar4 = (ushort *)(result->all_names_).payload_;
    full_name_00._M_len = (ulong)puVar4[1];
    full_name_00._M_str = (char *)((long)puVar4 + ~full_name_00._M_len);
    name._M_len = (ulong)*puVar4;
    name._M_str = (char *)((long)puVar4 + ~name._M_len);
    (result->super_SymbolBase).symbol_type_ = '\a';
    AddSymbol(this,full_name_00,(void *)0x0,name,&proto->super_Message,(Symbol)result);
    return;
  }
  BuildService();
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* /* dummy */,
                                     ServiceDescriptor* result,
                                     internal::FlatAllocator& alloc) {
  result->all_names_ =
      AllocateNameStrings(file_->package(), proto.name(), proto, alloc);
  result->file_ = file_;
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  AllocateOptions(proto, result, ServiceDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.ServiceOptions", alloc);

  AddSymbol(result->full_name(), nullptr, result->name(), proto,
            Symbol(result));
}